

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Stats.h
# Opt level: O1

bool TestHashList<unsigned_int>
               (vector<unsigned_int,_std::allocator<unsigned_int>_> *hashes,bool drawDiagram,
               bool testCollision,bool testDist,bool testHighBits,bool testLowBits)

{
  pointer puVar1;
  bool bVar2;
  bool bVar3;
  bool bVar4;
  bool bVar5;
  int iVar6;
  uint uVar7;
  long lVar8;
  undefined7 in_register_00000011;
  long lVar9;
  long lVar10;
  uint uVar11;
  double dVar12;
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  HashSet<unsigned_int> collisions;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_88;
  double local_68;
  _Rb_tree<unsigned_int,_unsigned_int,_std::_Identity<unsigned_int>,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
  local_60;
  
  bVar2 = true;
  if ((int)CONCAT71(in_register_00000011,testCollision) != 0) {
    iVar6 = (int)((ulong)((long)(hashes->
                                super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
                                _M_impl.super__Vector_impl_data._M_finish -
                         (long)(hashes->
                               super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
                               _M_impl.super__Vector_impl_data._M_start) >> 2);
    auVar14._0_8_ = (double)iVar6;
    local_68 = auVar14._0_8_ * (double)(iVar6 + -1);
    dVar12 = ldexp(1.0,0x20);
    auVar13._0_8_ = local_68 / dVar12;
    auVar13._8_8_ = 0;
    auVar14._8_8_ = 0;
    auVar13 = vminsd_avx(auVar14,auVar13);
    printf("Testing collisions (%3i-bit)     - Expected %12.1f, ",0x20);
    local_60._M_impl.super__Rb_tree_header._M_header._M_left =
         &local_60._M_impl.super__Rb_tree_header._M_header;
    local_60._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
    local_60._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    local_60._M_impl.super__Rb_tree_header._M_node_count = 0;
    local_60._M_impl.super__Rb_tree_header._M_header._M_right =
         local_60._M_impl.super__Rb_tree_header._M_header._M_left;
    uVar7 = FindCollisions<unsigned_int>(hashes,(HashSet<unsigned_int> *)&local_60,1000);
    dVar12 = (double)(int)uVar7 / auVar13._0_8_;
    printf("actual %6i (%.2fx)",(ulong)uVar7);
    bVar2 = dVar12 <= 2.0;
    if (!bVar2) {
      printf(" !!!!!");
    }
    putchar(10);
    if (testHighBits) {
      bVar2 = TestHighbitsCollisions<unsigned_int>(hashes);
      bVar3 = CountHighbitsCollisions<unsigned_int>(hashes,0xc);
      bVar4 = CountHighbitsCollisions<unsigned_int>(hashes,8);
      bVar2 = ((bVar2 && bVar3) && bVar4) && dVar12 <= 2.0;
    }
    if (testLowBits) {
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector(&local_88,hashes);
      puVar1 = local_88.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
               super__Vector_impl_data._M_start;
      lVar8 = (long)local_88.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                    .super__Vector_impl_data._M_finish -
              (long)local_88.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                    .super__Vector_impl_data._M_start >> 2;
      if (local_88.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_finish !=
          local_88.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_start) {
        lVar9 = 0;
        do {
          uVar7 = local_88.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                  super__Vector_impl_data._M_start[lVar9];
          lVar10 = 0x20;
          uVar11 = 0;
          do {
            uVar11 = (uVar7 & 1) + uVar11 * 2;
            uVar7 = uVar7 >> 1;
            lVar10 = lVar10 + -1;
          } while (lVar10 != 0);
          local_88.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_start[lVar9] = uVar11;
          lVar9 = lVar9 + 1;
        } while (lVar9 != lVar8 + (ulong)(lVar8 == 0));
      }
      if (local_88.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_start !=
          local_88.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_finish) {
        std::
        __introsort_loop<__gnu_cxx::__normal_iterator<unsigned_int*,std::vector<unsigned_int,std::allocator<unsigned_int>>>,long,__gnu_cxx::__ops::_Iter_less_iter>
                  (local_88.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                   super__Vector_impl_data._M_start,
                   local_88.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                   super__Vector_impl_data._M_finish,(int)LZCOUNT(lVar8) * 2 ^ 0x7e);
        std::
        __final_insertion_sort<__gnu_cxx::__normal_iterator<unsigned_int*,std::vector<unsigned_int,std::allocator<unsigned_int>>>,__gnu_cxx::__ops::_Iter_less_iter>
                  (puVar1,local_88.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_finish);
      }
      bVar3 = TestLowbitsCollisions<unsigned_int>(&local_88);
      bVar4 = CountLowbitsCollisions<unsigned_int>(&local_88,0xc);
      bVar5 = CountLowbitsCollisions<unsigned_int>(&local_88,8);
      puVar1 = local_88.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
               super__Vector_impl_data._M_start;
      local_88.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      local_88.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      local_88.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      if (puVar1 != (pointer)0x0) {
        operator_delete(puVar1);
      }
      if (local_88.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_88.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                        _M_impl.super__Vector_impl_data._M_start);
      }
      bVar2 = (bool)(bVar2 & bVar3 & (bVar4 && bVar5));
    }
    std::
    _Rb_tree<unsigned_int,_unsigned_int,_std::_Identity<unsigned_int>,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
    ::~_Rb_tree(&local_60);
  }
  if (testDist) {
    bVar3 = TestDistribution<unsigned_int>(hashes,drawDiagram);
    bVar2 = (bool)(bVar3 & bVar2);
  }
  return bVar2;
}

Assistant:

bool TestHashList ( std::vector<hashtype> & hashes, bool drawDiagram,
                    bool testCollision = true, bool testDist = true,
                    bool testHighBits = true, bool testLowBits = true )
{
  bool result = true;

  if(testCollision)
  {
    size_t count = hashes.size();
    double expected = EstimateNbCollisions(count, sizeof(hashtype) * 8);
    printf("Testing collisions (%3i-bit)     - Expected %12.1f, ",
           (int)sizeof(hashtype)*8, expected);

    double collcount = 0;
    HashSet<hashtype> collisions;
    collcount = FindCollisions(hashes, collisions, 1000);
    printf("actual %6i (%.2fx)", (int)collcount, collcount / expected);

    if(sizeof(hashtype) == sizeof(uint32_t))
    {
    // 2x expected collisions = fail

    // #TODO - collision failure cutoff needs to be expressed as a standard deviation instead
    // of a scale factor, otherwise we fail erroneously if there are a small expected number
    // of collisions

        if(double(collcount) / double(expected) > 2.0)
        {
          printf(" !!!!!");
          result = false;
        }
    }
    else
    {
      // For all hashes larger than 32 bits, _any_ collisions are a failure.

      if(collcount > 0)
      {
        printf(" !!!!!");
        result = false;
        //if(drawDiagram) PrintCollisions(hashes, collisions);
      }
    }

    printf("\n");

    if (testHighBits) {
      result &= CountHighbitsCollisions(hashes, 256);
      result &= CountHighbitsCollisions(hashes, 128);
      result &= CountHighbitsCollisions(hashes,  64);
      result &= CountHighbitsCollisions(hashes,  32);

      /*
        int const optimalNbBits = FindNbBitsForCollisionTarget(100, count);
        result &= CountHighbitsCollisions(hashes, optimalNbBits);
      */

      result &= TestHighbitsCollisions(hashes);
      result &= CountHighbitsCollisions(hashes,   12);
      result &= CountHighbitsCollisions(hashes,   8);
    }
    if (testLowBits) {
      // reverse: bitwise flip the hashes. lowest bits first
      std::vector<hashtype> revhashes = hashes;
      for (size_t i = 0; i < revhashes.size(); i++) {
        revhashes[i] = bitreverse(revhashes[i]);
      }
      std::sort(revhashes.begin(), revhashes.end());

      result &= CountLowbitsCollisions(revhashes, 128);
      result &= CountLowbitsCollisions(revhashes,  64);
      result &= CountLowbitsCollisions(revhashes,  32);

      /*
        int const optimalNbBits = FindNbBitsForCollisionTarget(100, count);
        result &= CountLowbitsCollisions(hashes, optimalNbBits);
      */

      result &= TestLowbitsCollisions(revhashes);
      result &= CountLowbitsCollisions(revhashes,   12);
      result &= CountLowbitsCollisions(revhashes,   8);

      std::vector<hashtype>().swap(revhashes);
      //revhashes.clear();
    }
  }


  //----------

  if(testDist)
  {
    result &= TestDistribution(hashes,drawDiagram);
  }

  return result;
}